

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O0

int sock_read(BIO *b,char *out,int outl)

{
  int iVar1;
  ssize_t sVar2;
  int ret;
  int outl_local;
  char *out_local;
  BIO *b_local;
  
  if (out == (char *)0x0) {
    b_local._4_4_ = 0;
  }
  else {
    bio_clear_socket_error();
    sVar2 = read(b->num,out,(long)outl);
    b_local._4_4_ = (int)sVar2;
    BIO_clear_retry_flags(b);
    if ((b_local._4_4_ < 1) && (iVar1 = bio_socket_should_retry(b_local._4_4_), iVar1 != 0)) {
      BIO_set_retry_read(b);
    }
  }
  return b_local._4_4_;
}

Assistant:

static int sock_read(BIO *b, char *out, int outl) {
  if (out == NULL) {
    return 0;
  }

  bio_clear_socket_error();
#if defined(OPENSSL_WINDOWS)
  int ret = recv(b->num, out, outl, 0);
#else
  int ret = (int)read(b->num, out, outl);
#endif
  BIO_clear_retry_flags(b);
  if (ret <= 0) {
    if (bio_socket_should_retry(ret)) {
      BIO_set_retry_read(b);
    }
  }
  return ret;
}